

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverSyntaxTest::BuildFile
          (DescriptorPoolTypeResolverSyntaxTest *this,string_view file_contents)

{
  FileDescriptor *pFVar1;
  FileDescriptor *extraout_RAX;
  FileDescriptorProto proto;
  LogMessageFatal local_118;
  FileDescriptorProto local_108;
  
  local_118.super_LogMessage.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )file_contents._M_str;
  local_118.super_LogMessage._0_8_ = file_contents._M_len;
  ParseTextOrDie::operator_cast_to_FileDescriptorProto(&local_108,(ParseTextOrDie *)&local_118);
  pFVar1 = DescriptorPool::BuildFile(&this->pool_,&local_108);
  if (pFVar1 != (FileDescriptor *)0x0) {
    FileDescriptorProto::~FileDescriptorProto(&local_108);
    return extraout_RAX;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
             ,0x1ab,"file != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_118);
}

Assistant:

const FileDescriptor* BuildFile(absl::string_view file_contents) {
    FileDescriptorProto proto = ParseTextOrDie(file_contents);
    const FileDescriptor* file = pool_.BuildFile(proto);
    ABSL_CHECK(file != nullptr);
    return file;
  }